

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_view_unittest.cpp
# Opt level: O3

void __thiscall array_view_const_view_Test::TestBody(array_view_const_view_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  long lVar6;
  void *__ptr;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  void *ptr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  internal local_48;
  undefined7 uStack_47;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  iVar5 = posix_memalign((void **)&local_48,8,0x28);
  auVar3 = _DAT_0014c360;
  auVar2 = _DAT_0014bb30;
  auVar1 = _DAT_0014bb20;
  lVar6 = 0;
  __ptr = (void *)0x0;
  if (iVar5 == 0) {
    __ptr = (void *)CONCAT71(uStack_47,local_48);
  }
  do {
    iVar5 = (int)lVar6;
    auVar8._8_4_ = iVar5;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar9 = (auVar8 | auVar1) ^ auVar2;
    if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffff6) {
      *(int *)((long)__ptr + lVar6 * 4) = iVar5;
      *(int *)((long)__ptr + lVar6 * 4 + 4) = iVar5 + 1;
    }
    auVar8 = (auVar8 | auVar3) ^ auVar2;
    if (auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffff6) {
      *(int *)((long)__ptr + lVar6 * 4 + 8) = iVar5 + 2;
      *(int *)((long)__ptr + lVar6 * 4 + 0xc) = iVar5 + 3;
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0xc);
  lVar6 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (&local_48,"v[i]","v_const[i]",(int *)((long)__ptr + lVar6),
               (int *)((long)__ptr + lVar6));
    if (local_48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar7 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x15,pcVar7);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  lVar6 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (&local_48,"v[i]","v_const[i]",(int *)((long)__ptr + lVar6),
               (int *)((long)__ptr + lVar6));
    if (local_48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar7 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x1b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  lVar6 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (&local_48,"v[i]","v_const[i]",(int *)((long)__ptr + lVar6),
               (int *)((long)__ptr + lVar6));
    if (local_48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar7 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar7 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x21,pcVar7);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (((local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x28);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(array_view, const_view) {
    using vector = memory::HostVector<int>;
    using view   = vector::view_type;
    using const_view  = vector::const_view_type;

    vector v(10);
    std::iota(v.begin(), v.end(), 0);

    view v_non_const = v;

    {
        const_view v_const(v);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v_non_const);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v(memory::all));
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
}